

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::RandomBernoulliDynamicLayerParams::MergePartialFromCodedStream
          (RandomBernoulliDynamicLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  ulong uVar6;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0051df89;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0051df89:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) {
LAB_0051dfdf:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
    }
    else {
      uVar5 = (uint)(uVar6 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar6 != '\x15') goto LAB_0051dfdf;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&this->prob_);
      }
      else {
        if ((uVar5 != 1) || ((char)uVar6 != '\b')) goto LAB_0051dfdf;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,&this->seed_);
      }
    }
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool RandomBernoulliDynamicLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float prob = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &prob_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  return false;
#undef DO_
}